

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::UpdateObjectTypeValue
          (GlobOpt *this,Value *value,JITTypeHolder type,bool setType,EquivalentTypeSet *typeSet,
          bool setTypeSet)

{
  code *pcVar1;
  bool bVar2;
  ValueInfo *pVVar3;
  undefined4 *puVar4;
  JsTypeValueInfo *local_40;
  JsTypeValueInfo *valueInfo;
  bool setTypeSet_local;
  EquivalentTypeSet *typeSet_local;
  bool setType_local;
  Value *value_local;
  GlobOpt *this_local;
  JITTypeHolder type_local;
  
  pVVar3 = ::Value::GetValueInfo(value);
  if (pVVar3 != (ValueInfo *)0x0) {
    pVVar3 = ::Value::GetValueInfo(value);
    bVar2 = ValueInfo::IsJsType(pVVar3);
    if (bVar2) goto LAB_0060467d;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                     ,0x726,
                     "(value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType())",
                     "value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_0060467d:
  pVVar3 = ::Value::GetValueInfo(value);
  local_40 = ValueInfo::AsJsType(pVVar3);
  bVar2 = JsTypeValueInfo::GetIsShared(local_40);
  if (bVar2) {
    local_40 = JsTypeValueInfo::Copy(local_40,this->alloc);
    ::Value::SetValueInfo(value,&local_40->super_ValueInfo);
  }
  if (setType) {
    JsTypeValueInfo::SetJsType(local_40,type);
  }
  if (setTypeSet) {
    JsTypeValueInfo::SetJsTypeSet(local_40,typeSet);
  }
  return;
}

Assistant:

void
GlobOpt::UpdateObjectTypeValue(Value* value, const JITTypeHolder type, bool setType, Js::EquivalentTypeSet* typeSet, bool setTypeSet)
{
    Assert(value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType());
    JsTypeValueInfo* valueInfo = value->GetValueInfo()->AsJsType();

    if (valueInfo->GetIsShared())
    {
        valueInfo = valueInfo->Copy(this->alloc);
        value->SetValueInfo(valueInfo);
    }

    if (setType)
    {
        valueInfo->SetJsType(type);
    }
    if (setTypeSet)
    {
        valueInfo->SetJsTypeSet(typeSet);
    }
}